

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::GetSourceObjectIfAny(CopyPropagateArrays *this,uint32_t result)

{
  Op OVar1;
  IRContext *this_00;
  DefUseManager *this_01;
  Instruction *this_02;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  Instruction *insert_inst;
  Instruction *result_inst;
  uint32_t result_local;
  CopyPropagateArrays *this_local;
  
  insert_inst = (Instruction *)CONCAT44(in_register_00000034,result);
  this_00 = Pass::context((Pass *)insert_inst);
  this_01 = IRContext::get_def_use_mgr(this_00);
  this_02 = analysis::DefUseManager::GetDef(this_01,in_EDX);
  OVar1 = Instruction::opcode(this_02);
  if (OVar1 - OpLoad < 0x16 || OVar1 == OpCopyObject) {
    switch((long)&switchD_0031dacb::switchdataD_005ef278 +
           (long)(int)(&switchD_0031dacb::switchdataD_005ef278)[OVar1 - OpLoad]) {
    case 0x31dacd:
      BuildMemoryObjectFromLoad(this,insert_inst);
      break;
    case 0x31dae0:
      BuildMemoryObjectFromExtract(this,insert_inst);
      break;
    case 0x31daf3:
      BuildMemoryObjectFromCompositeConstruct(this,insert_inst);
      break;
    case 0x31db06:
      Instruction::GetSingleWordInOperand(this_02,0);
      GetSourceObjectIfAny(this,result);
      break;
    case 0x31db22:
      BuildMemoryObjectFromInsert(this,insert_inst);
      break;
    default:
      goto switchD_0031dacb_caseD_31db35;
    }
  }
  else {
switchD_0031dacb_caseD_31db35:
    std::
    unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
    ::unique_ptr<std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,void>
              ((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>>
                *)this,(nullptr_t)0x0);
  }
  return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::GetSourceObjectIfAny(uint32_t result) {
  Instruction* result_inst = context()->get_def_use_mgr()->GetDef(result);

  switch (result_inst->opcode()) {
    case spv::Op::OpLoad:
      return BuildMemoryObjectFromLoad(result_inst);
    case spv::Op::OpCompositeExtract:
      return BuildMemoryObjectFromExtract(result_inst);
    case spv::Op::OpCompositeConstruct:
      return BuildMemoryObjectFromCompositeConstruct(result_inst);
    case spv::Op::OpCopyObject:
      return GetSourceObjectIfAny(result_inst->GetSingleWordInOperand(0));
    case spv::Op::OpCompositeInsert:
      return BuildMemoryObjectFromInsert(result_inst);
    default:
      return nullptr;
  }
}